

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.h
# Opt level: O0

bool __thiscall
wallet::WalletBatch::WriteIC<std::pair<std::__cxx11::string,uint256>,wallet::WalletDescriptor>
          (WalletBatch *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint256>
          *key,WalletDescriptor *value,bool fOverwrite)

{
  byte bVar1;
  bool bVar2;
  __int_type_conflict2 _Var3;
  pointer pDVar4;
  byte in_CL;
  long in_RDI;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_uint256>
  *unaff_retaddr;
  DatabaseBatch *in_stack_00000008;
  unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
  *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_fffffffffffffff7;
  WalletDescriptor *value_00;
  
  value_00 = *(WalletDescriptor **)(in_FS_OFFSET + 0x28);
  bVar1 = in_CL & 1;
  std::unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>::operator->
            (in_stack_ffffffffffffffb8);
  bVar2 = DatabaseBatch::Write<std::pair<std::__cxx11::string,uint256>,wallet::WalletDescriptor>
                    (in_stack_00000008,unaff_retaddr,value_00,(bool)in_stack_fffffffffffffff7);
  if (bVar2) {
    (**(code **)(**(long **)(in_RDI + 8) + 0x50))();
    _Var3 = std::__atomic_base::operator_cast_to_unsigned_int
                      ((__atomic_base<unsigned_int> *)CONCAT17(bVar1,in_stack_ffffffffffffffd0));
    if (_Var3 % 1000 == 0) {
      pDVar4 = std::unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>::
               operator->(in_stack_ffffffffffffffb8);
      (*pDVar4->_vptr_DatabaseBatch[6])();
    }
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  if (*(WalletDescriptor **)(in_FS_OFFSET + 0x28) == value_00) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool WriteIC(const K& key, const T& value, bool fOverwrite = true)
    {
        if (!m_batch->Write(key, value, fOverwrite)) {
            return false;
        }
        m_database.IncrementUpdateCounter();
        if (m_database.nUpdateCounter % 1000 == 0) {
            m_batch->Flush();
        }
        return true;
    }